

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O2

int IDASetRootDirection(void *ida_mem,int *rootdir)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    line = 0x27f;
  }
  else {
    uVar1 = *(uint *)((long)ida_mem + 0x438);
    if (uVar1 != 0) {
      uVar2 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar2 = 0;
      }
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        *(int *)(*(long *)((long)ida_mem + 0x448) + uVar3 * 4) = rootdir[uVar3];
      }
      return 0;
    }
    msgfmt = "Rootfinding was not initialized.";
    error_code = -0x16;
    line = 0x288;
  }
  IDAProcessError((IDAMem)0x0,error_code,line,"IDASetRootDirection",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetRootDirection(void* ida_mem, int* rootdir)
{
  IDAMem IDA_mem;
  int i, nrt;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  nrt = IDA_mem->ida_nrtfn;
  if (nrt == 0)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_ROOT);
    return (IDA_ILL_INPUT);
  }

  for (i = 0; i < nrt; i++) { IDA_mem->ida_rootdir[i] = rootdir[i]; }

  return (IDA_SUCCESS);
}